

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O2

FuncInfo * PostVisitFunction(ParseNodeFnc *pnodeFnc,ByteCodeGenerator *byteCodeGenerator)

{
  Type *pTVar1;
  undefined1 *puVar2;
  ushort uVar3;
  Scope *this;
  ParseNode *this_00;
  ParseNodeBlock *pPVar4;
  ParseableFunctionInfo *pPVar5;
  code *pcVar6;
  bool bVar7;
  BOOL BVar8;
  RegSlot RVar9;
  FuncInfo *pFVar10;
  Symbol *pSVar11;
  FuncInfo *pFVar12;
  FunctionBody *pFVar13;
  undefined4 *puVar14;
  ParseNodePtr pPVar15;
  ParseNodeParamPattern *pPVar16;
  Scope *pSVar17;
  uint uVar18;
  char *in_RCX;
  FuncInfo *extraout_RDX;
  FuncInfo *extraout_RDX_00;
  byte bVar19;
  ulong uVar20;
  short sVar21;
  anon_class_16_2_de35cfdd handler;
  anon_class_16_2_de35cfdd handler_00;
  anon_class_16_2_d47fbb80 fn;
  anon_class_16_2_d47fbb80 fn_00;
  anon_class_16_2_de35cfdd local_60;
  uint local_4c;
  Symbol *local_48;
  undefined1 local_3c [4];
  undefined1 auStack_38 [4];
  uint i;
  FuncInfo *top;
  
  pFVar10 = ByteCodeGenerator::TopFuncInfo(byteCodeGenerator);
  _auStack_38 = pFVar10;
  pSVar11 = ParseNodeFnc::GetFuncSymbol(pnodeFnc);
  bVar7 = FuncInfo::IsGlobalFunction(pFVar10);
  uVar20 = 0;
  if ((pSVar11 != (Symbol *)0x0) && (!bVar7)) {
    uVar20 = ((ulong)(byte)pSVar11->field_0x42 & 0xffffffffffffff20) >> 5;
  }
  local_48 = pSVar11;
  BVar8 = FuncInfo::IsLambda(pFVar10);
  pFVar12 = pFVar10;
  if (BVar8 != 0) {
    pFVar12 = ByteCodeGenerator::FindEnclosingNonLambda(byteCodeGenerator);
    bVar7 = FuncInfo::IsGlobalFunction(pFVar12);
    if (bVar7) {
      Js::FunctionProxy::SetEnclosedByGlobalFunc(&pFVar10->byteCodeFunction->super_FunctionProxy);
    }
  }
  bVar7 = FuncAllowsDirectSuper(pFVar12,byteCodeGenerator);
  if (bVar7) {
    pTVar1 = &((pFVar10->byteCodeFunction->super_FunctionProxy).functionInfo.ptr)->attributes;
    *pTVar1 = *pTVar1 | AllowDirectSuper;
  }
  if ((char)uVar20 != '\0') {
    bVar7 = Js::ParseableFunctionInfo::IsFunctionParsed(pFVar10->byteCodeFunction);
    if ((bVar7) &&
       (pFVar13 = FuncInfo::GetParsedFunctionBody(pFVar10), (pFVar13->field_0x17a & 0x40) != 0)) {
      pFVar10->field_0xb5 = pFVar10->field_0xb5 | 2;
    }
    if ((local_48->field_0x42 & 0x10) != 0) {
      pFVar12 = (FuncInfo *)byteCodeGenerator;
      ByteCodeGenerator::ProcessCapturedSym(byteCodeGenerator,local_48);
      pFVar10->field_0xb5 = pFVar10->field_0xb5 | 2;
      if (pnodeFnc->pnodeBody != (ParseNodePtr)0x0) {
        pFVar12 = pFVar10;
        pFVar13 = FuncInfo::GetParsedFunctionBody(pFVar10);
        pFVar13->field_0x17a = pFVar13->field_0x17a | 0x40;
      }
      ByteCodeGenerator::ProcessScopeWithCapturedSym((ByteCodeGenerator *)pFVar12,local_48->scope);
    }
  }
  if ((pnodeFnc->super_ParseNode).nop == knopProg) {
LAB_007801d5:
    if ((((pFVar10->byteCodeFunction->super_FunctionProxy).field_0x46 & 1) != 0) &&
       ((byteCodeGenerator->flags & 0x400) != 0)) {
      Scope::SetIsObject(pFVar10->bodyScope);
    }
  }
  else {
    pSVar17 = pFVar10->bodyScope;
    if ((((pSVar17->field_0x44 & 2) == 0) &&
        (bVar7 = ByteCodeGenerator::NeedObjectAsFunctionScope(byteCodeGenerator,pFVar10,pnodeFnc),
        bVar7)) && (Scope::SetIsObject(pSVar17), (pFVar10->field_0xb5 & 0x80) == 0)) {
      Scope::SetIsObject(pFVar10->paramScope);
    }
    if ((pnodeFnc->super_ParseNode).nop == knopProg) goto LAB_007801d5;
  }
  if (pnodeFnc->pnodeBody != (ParseNodePtr)0x0) {
    bVar7 = FuncInfo::IsGlobalFunction(pFVar10);
    if (!bVar7) {
      pSVar17 = pFVar10->paramScope;
      this = pFVar10->bodyScope;
      pFVar12 = extraout_RDX;
      if ((pSVar17 != (Scope *)0x0) && ((pSVar17->field_0x45 & 1) != 0)) {
        fn.top = extraout_RDX;
        fn.byteCodeGenerator = byteCodeGenerator;
        Scope::ForEachSymbol<PostVisitFunction(ParseNodeFnc*,ByteCodeGenerator*)::__0>(pSVar17,fn);
        pFVar10->field_0xb4 = pFVar10->field_0xb4 | 0x40;
        pFVar12 = extraout_RDX_00;
      }
      if ((this->field_0x45 & 1) != 0) {
        fn_00.top = pFVar12;
        fn_00.byteCodeGenerator = byteCodeGenerator;
        Scope::ForEachSymbol<PostVisitFunction(ParseNodeFnc*,ByteCodeGenerator*)::__0>(this,fn_00);
        pFVar10->field_0xb4 = pFVar10->field_0xb4 | 0x40;
      }
      PostVisitBlock(pnodeFnc->pnodeBodyScope,byteCodeGenerator);
      PostVisitBlock(pnodeFnc->pnodeScopes,byteCodeGenerator);
    }
    if ((((pnodeFnc->nestedCount != 0) || ((pFVar10->field_0xb4 & 0x82) != 0)) ||
        (byteCodeGenerator->dynamicScopeCount != 0)) || ((byteCodeGenerator->flags & 0x404) != 0)) {
      ByteCodeGenerator::SetNeedEnvRegister(byteCodeGenerator);
    }
    bVar7 = FuncInfo::IsGlobalFunction(pFVar10);
    if (bVar7) {
      bVar7 = FuncInfo::IsGlobalFunction(pFVar10);
      if ((!bVar7) && ((pnodeFnc->fncFlags & kFunctionIsModule) == kFunctionNone)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar14 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                           ,0xb78,"(top->IsGlobalFunction() || pnodeFnc->IsModule())",
                           "top->IsGlobalFunction() || pnodeFnc->IsModule()");
        if (!bVar7) goto LAB_00780d45;
        *puVar14 = 0;
      }
      if ((((pFVar10->byteCodeFunction->super_FunctionProxy).field_0x46 & 1) != 0) &&
         ((byteCodeGenerator->flags & 0x400) != 0)) {
        ByteCodeGenerator::SetNeedEnvRegister(byteCodeGenerator);
        ByteCodeGenerator::AssignFrameObjRegister(byteCodeGenerator);
        ByteCodeGenerator::AssignFrameDisplayRegister(byteCodeGenerator);
      }
    }
    else {
      uVar18 = *(uint *)&pFVar10->field_0xb4;
      sVar21 = (short)uVar18;
      if ((uVar18 & 2) == 0) {
        if ((uVar18 & 4) != 0) {
LAB_007803b0:
          if ((uVar18 & 0x40) != 0) {
            ByteCodeGenerator::AssignFrameSlotsRegister(byteCodeGenerator);
            sVar21 = (short)*(undefined4 *)&pFVar10->field_0xb4;
          }
          goto LAB_007803c6;
        }
        if ((uVar18 & 8) != 0) {
          bVar7 = ByteCodeGenerator::NeedScopeObjectForArguments(byteCodeGenerator,pFVar10,pnodeFnc)
          ;
          if (((uVar18 & 0x40) == 0) && (!bVar7)) goto LAB_00780384;
          goto LAB_007803b0;
        }
        if ((uVar18 & 0x40) != 0) goto LAB_007803b0;
LAB_00780384:
        if (pFVar10->funcExprScope == (Scope *)0x0) {
          if (-1 < sVar21) goto LAB_007803b0;
        }
        else if ((-1 < sVar21) || ((*(ushort *)&pFVar10->funcExprScope->field_0x44 & 0x10) != 0))
        goto LAB_007803b0;
      }
      else {
LAB_007803c6:
        if (-1 < sVar21) {
          ByteCodeGenerator::AssignParamSlotsRegister(byteCodeGenerator);
        }
        bVar7 = ByteCodeGenerator::NeedObjectAsFunctionScope
                          (byteCodeGenerator,pFVar10,pFVar10->root);
        if (((bVar7) || ((pFVar10->bodyScope->field_0x44 & 2) != 0)) ||
           ((pFVar10->paramScope->field_0x44 & 2) != 0)) {
          ByteCodeGenerator::AssignFrameObjRegister(byteCodeGenerator);
        }
        if ((((*(uint *)&pFVar10->field_0xb4 & 2) != 0) || (pnodeFnc->nestedCount != 0)) ||
           (((*(uint *)&pFVar10->field_0xb4 & 8) != 0 &&
            ((pnodeFnc->pnodeParams != (ParseNodePtr)0x0 &&
             (bVar7 = ByteCodeGenerator::IsInDebugMode(byteCodeGenerator), bVar7)))))) {
          ByteCodeGenerator::SetNeedEnvRegister(byteCodeGenerator);
          ByteCodeGenerator::AssignFrameDisplayRegister(byteCodeGenerator);
        }
      }
      if ((pFVar10->field_0xb4 & 8) != 0) {
        local_4c = (uint)uVar20;
        pSVar11 = pFVar10->argumentsSymbol;
        if (pSVar11 == (Symbol *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar14 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                             ,0xb46,"(argSym)","argSym");
          if (!bVar7) goto LAB_00780d45;
          *puVar14 = 0;
          uVar20 = (ulong)local_4c;
        }
        else {
          if (pFVar10->bodyScope->scopeSlotCount != 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar14 = 1;
            in_RCX = "top->bodyScope->GetScopeSlotCount() == 0";
            bVar7 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                               ,0xb49,"(top->bodyScope->GetScopeSlotCount() == 0)",
                               "top->bodyScope->GetScopeSlotCount() == 0");
            if (!bVar7) goto LAB_00780d45;
            *puVar14 = 0;
          }
          if (pFVar10->argsPlaceHolderSlotCount != 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar14 = 1;
            in_RCX = "top->argsPlaceHolderSlotCount == 0";
            bVar7 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                               ,0xb4a,"(top->argsPlaceHolderSlotCount == 0)",
                               "top->argsPlaceHolderSlotCount == 0");
            if (!bVar7) goto LAB_00780d45;
            *puVar14 = 0;
          }
          ByteCodeGenerator::AssignRegister(byteCodeGenerator,pSVar11);
          local_3c = (undefined1  [4])0x0;
          bVar7 = ByteCodeGenerator::NeedScopeObjectForArguments(byteCodeGenerator,pFVar10,pnodeFnc)
          ;
          if (bVar7) {
            local_60.top = (FuncInfo **)auStack_38;
            local_60.i = (uint *)local_3c;
            for (pPVar15 = pnodeFnc->pnodeParams; pPVar15 != (ParseNode *)0x0;
                pPVar15 = ParseNode::GetFormalNext(pPVar15)) {
              PostVisitFunction::anon_class_16_2_de35cfdd::operator()(&local_60,pPVar15);
            }
            if (pnodeFnc->pnodeRest != (ParseNode *)0x0) {
              PostVisitFunction::anon_class_16_2_de35cfdd::operator()(&local_60,pnodeFnc->pnodeRest)
              ;
            }
            bVar7 = Symbol::NeedsSlotAlloc(pSVar11,byteCodeGenerator,_auStack_38);
            if (bVar7) {
              if (pSVar11->scopeSlot != -1) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
                *puVar14 = 1;
                bVar7 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                                   ,0xb65,"(argSym->GetScopeSlot() == Js::Constants::NoProperty)",
                                   "argSym->GetScopeSlot() == Js::Constants::NoProperty");
                if (!bVar7) goto LAB_00780d45;
                *puVar14 = 0;
              }
              in_RCX = (char *)(ulong)((int)local_3c + 1U);
              pSVar11->scopeSlot = (PropertyId)local_3c;
              local_3c = (undefined1  [4])((int)local_3c + 1U);
            }
            for (pPVar15 = pnodeFnc->pnodeParams; pPVar15 != (ParseNode *)0x0;
                pPVar15 = ParseNode::GetFormalNext(pPVar15)) {
              if (pPVar15->nop == knopParamPattern) {
                pPVar16 = ParseNode::AsParseNodeParamPattern(pPVar15);
                handler.i = (uint *)in_RCX;
                handler.top = (FuncInfo **)local_3c;
                Parser::MapBindIdentifier<PostVisitFunction(ParseNodeFnc*,ByteCodeGenerator*)::__1>
                          ((Parser *)(pPVar16->super_ParseNodeUni).pnode1,(ParseNodePtr)auStack_38,
                           handler);
              }
            }
            this_00 = pnodeFnc->pnodeRest;
            if ((this_00 != (ParseNode *)0x0) && (this_00->nop == knopParamPattern)) {
              pPVar16 = ParseNode::AsParseNodeParamPattern(this_00);
              handler_00.i = (uint *)in_RCX;
              handler_00.top = (FuncInfo **)local_3c;
              Parser::MapBindIdentifier<PostVisitFunction(ParseNodeFnc*,ByteCodeGenerator*)::__1>
                        ((Parser *)(pPVar16->super_ParseNodeUni).pnode1,(ParseNodePtr)auStack_38,
                         handler_00);
            }
          }
          _auStack_38->paramScope->scopeSlotCount = (uint)local_3c;
          uVar20 = (ulong)local_4c;
          if ((_auStack_38->field_0xb4 & 0x10) == 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar14 = 1;
            bVar7 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                               ,0xb6d,"(top->GetHasHeapArguments())","top->GetHasHeapArguments()");
            if (!bVar7) goto LAB_00780d45;
            *puVar14 = 0;
          }
          pFVar10 = _auStack_38;
          bVar7 = ByteCodeGenerator::NeedScopeObjectForArguments
                            (byteCodeGenerator,_auStack_38,pnodeFnc);
          if ((bVar7) &&
             ((pnodeFnc->fncFlags & kFunctionHasNonSimpleParameterList) == kFunctionNone)) {
            puVar2 = &(pFVar10->byteCodeFunction->super_FunctionProxy).field_0x47;
            *puVar2 = *puVar2 & 0xfb;
          }
        }
      }
    }
    if (pFVar10->newTargetSymbol != (Symbol *)0x0) {
      ByteCodeGenerator::AssignRegister(byteCodeGenerator,pFVar10->newTargetSymbol);
      pFVar10 = _auStack_38;
    }
    if (pFVar10->thisSymbol != (Symbol *)0x0) {
      ByteCodeGenerator::AssignRegister(byteCodeGenerator,pFVar10->thisSymbol);
      bVar7 = FuncInfo::IsGlobalFunction(_auStack_38);
      if (bVar7) {
        ByteCodeGenerator::AssignNullConstRegister(byteCodeGenerator);
      }
    }
    if (_auStack_38->superSymbol != (Symbol *)0x0) {
      ByteCodeGenerator::AssignRegister(byteCodeGenerator,_auStack_38->superSymbol);
    }
    if (_auStack_38->superConstructorSymbol != (Symbol *)0x0) {
      ByteCodeGenerator::AssignRegister(byteCodeGenerator,_auStack_38->superConstructorSymbol);
    }
    if (_auStack_38->importMetaSymbol != (Symbol *)0x0) {
      ByteCodeGenerator::AssignRegister(byteCodeGenerator,_auStack_38->importMetaSymbol);
    }
    if ((local_48 == (Symbol *)0x0) && ((char)uVar20 == '\x01')) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar14 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0xb9f,"(!funcExprWithName || sym)","!funcExprWithName || sym");
      if (!bVar7) goto LAB_00780d45;
      *puVar14 = 0;
    }
    if ((char)uVar20 != '\0') {
      if (_auStack_38->funcExprScope == (Scope *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar14 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                           ,0xba2,"(top->funcExprScope)","top->funcExprScope");
        if (!bVar7) goto LAB_00780d45;
        *puVar14 = 0;
      }
      if ((_auStack_38->field_0xb4 & 6) != 0) {
        Scope::SetIsObject(_auStack_38->funcExprScope);
      }
      pSVar17 = _auStack_38->funcExprScope;
      if ((pSVar17->field_0x44 & 2) != 0) {
        RVar9 = ByteCodeGenerator::NextVarRegister(byteCodeGenerator);
        pSVar17->location = RVar9;
      }
    }
  }
  ByteCodeGenerator::EndBindFunction(byteCodeGenerator,SUB81(uVar20,0));
  bVar7 = FuncInfo::IsGlobalFunction(_auStack_38);
  if (bVar7) {
    return _auStack_38;
  }
  if ((_auStack_38->field_0xb5 & 0x80) == 0) {
    if ((_auStack_38->bodyScope->field_0x44 & 2) >> 1 !=
        (_auStack_38->paramScope->field_0x44 & 2) >> 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar14 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0xbc0,"(top->bodyScope->GetIsObject() == top->paramScope->GetIsObject())",
                         "top->bodyScope->GetIsObject() == top->paramScope->GetIsObject()");
      if (bVar7) {
        *puVar14 = 0;
        Js::Throw::FatalInternalError(-0x7fffbffb);
      }
      goto LAB_00780d45;
    }
  }
  else {
    Scope::MergeParamAndBodyScopes(pnodeFnc);
    Scope::RemoveParamScope(pnodeFnc);
  }
  pFVar10 = ByteCodeGenerator::TopFuncInfo(byteCodeGenerator);
  pFVar13 = Js::FunctionProxy::GetFunctionBody(&pFVar10->byteCodeFunction->super_FunctionProxy);
  if (pFVar13 == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar14 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                       ,0xbc6,"(parentFunctionBody != nullptr)","parentFunctionBody != nullptr");
    if (!bVar7) goto LAB_00780d45;
    *puVar14 = 0;
  }
  uVar18 = *(uint *)&pFVar13->field_0x178;
  if (((pnodeFnc->fncFlags & kFunctionHasHomeObj) != kFunctionNone) &&
     (pnodeFnc->homeObjLocation == 0xffffffff)) {
    RVar9 = FuncInfo::AssignUndefinedConstRegister(pFVar10);
    pnodeFnc->homeObjLocation = RVar9;
  }
  bVar7 = FuncInfo::IsGlobalFunction(pFVar10);
  if (bVar7) {
    if (((byteCodeGenerator->flags & 0x800) != 0) &&
       (byteCodeGenerator->parentScopeInfo == (ScopeInfo *)0x0)) {
      pSVar17 = FuncInfo::GetGlobalEvalBlockScope(pFVar10);
      if ((*(uint *)&pSVar17->field_0x44 >> 8 & 1) != 0) {
        *(ushort *)&pSVar17->field_0x44 = (ushort)*(uint *)&pSVar17->field_0x44 | 0x10;
      }
    }
  }
  else {
    if (((uVar18 >> 0x15 & 1) != 0) && ((pFVar13->field_0x17a & 0x10) != 0)) {
      Scope::SetIsObject(pFVar10->bodyScope);
      Scope::SetIsObject(pFVar10->paramScope);
    }
    bVar7 = ByteCodeGenerator::CanStackNestedFunc(byteCodeGenerator,_auStack_38,false);
    if ((!bVar7) ||
       (bVar7 = ByteCodeGenerator::NeedObjectAsFunctionScope(byteCodeGenerator,_auStack_38,pnodeFnc)
       , bVar7)) {
      FuncInfo::SetHasMaybeEscapedNestedFunc(pFVar10,L"Child");
    }
  }
  if ((_auStack_38->field_0xb4 & 6) == 0) {
    if ((uVar18 >> 0x15 & 1) == 0) goto LAB_00780c18;
  }
  else {
    uVar18 = *(uint *)&pFVar10->field_0xb4 | 4;
    *(uint *)&pFVar10->field_0xb4 = uVar18;
    pPVar4 = byteCodeGenerator->currentBlock;
    if (pPVar4 != (ParseNodeBlock *)0x0) {
      if ((pPVar4->super_ParseNodeStmt).super_ParseNode.nop != knopBlock) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        local_48 = (Symbol *)__tls_get_addr(&PTR_013e5f18);
        *(undefined4 *)&(local_48->name).string.ptr = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                           ,0xbf5,"(currentBlock->nop == knopBlock)",
                           "currentBlock->nop == knopBlock");
        if (!bVar7) {
LAB_00780d45:
          pcVar6 = (code *)invalidInstructionException();
          (*pcVar6)();
        }
        *(undefined4 *)&(local_48->name).string.ptr = 0;
      }
      pPVar4->field_0x5c = pPVar4->field_0x5c | 8;
      uVar18 = *(uint *)&pFVar10->field_0xb4;
    }
    *(uint *)&pFVar10->field_0xb4 = uVar18 | 0x10;
    puVar2 = &(pFVar10->byteCodeFunction->super_FunctionProxy).field_0x45;
    *(ushort *)puVar2 = *(ushort *)puVar2 & 0xdfff;
    pFVar13->field_0x17a = pFVar13->field_0x17a | 0x20;
    if (_auStack_38->funcExprScope != (Scope *)0x0) {
      Scope::SetIsObject(_auStack_38->funcExprScope);
    }
    if (pFVar10->inArgsCount == 1) {
      ByteCodeGenerator::AssignNullConstRegister(byteCodeGenerator);
    }
  }
  if ((pFVar13->field_0x17b & 8) == 0) {
    Scope::ForceAllSymbolNonLocalReference(pFVar10->bodyScope,byteCodeGenerator);
    bVar7 = FuncInfo::IsGlobalFunction(pFVar10);
    if (!bVar7) {
      Scope::ForceAllSymbolNonLocalReference(pFVar10->paramScope,byteCodeGenerator);
    }
    pFVar13->field_0x17b = pFVar13->field_0x17b | 8;
  }
LAB_00780c18:
  if ((pnodeFnc->fncFlags & kFunctionIsGenerator) != kFunctionNone) {
    FuncInfo::AssignUndefinedConstRegister(_auStack_38);
  }
  if (((((_auStack_38->root->fncFlags & (kFunctionIsAsync|kFunctionIsLambda|kFunctionIsAccessor)) ==
         kFunctionNone) && ((_auStack_38->field_0xb4 & 6) != 0)) ||
      (BVar8 = FuncInfo::IsClassConstructor(_auStack_38), BVar8 != 0)) &&
     (BVar8 = FuncInfo::IsBaseClassConstructor(_auStack_38), BVar8 == 0)) {
    FuncInfo::AssignUndefinedConstRegister(_auStack_38);
  }
  AssignFuncSymRegister(pnodeFnc,byteCodeGenerator,_auStack_38);
  if ((pnodeFnc->pnodeBody != (ParseNodePtr)0x0) && ((~pnodeFnc->fncFlags & 0x28) == 0)) {
    pPVar5 = _auStack_38->byteCodeFunction;
    uVar3 = *(ushort *)&(pPVar5->super_FunctionProxy).field_0x45;
    uVar18 = *(uint *)&_auStack_38->field_0xb4;
    if ((uVar18 & 0x40) == 0) {
      bVar19 = 0;
    }
    else {
      bVar19 = _auStack_38->paramScope->field_0x45 & 1;
    }
    if (((uVar3 >> 0xd & 1) != 0) && (1 < _auStack_38->inArgsCount)) {
      if (bVar19 == 0) {
        if ((((uVar18 & 0x40) == 0) && ((byteCodeGenerator->flags & 0x400) == 0)) &&
           (((pPVar5->super_FunctionProxy).field_0x47 & 1) == 0)) {
          *(ushort *)&(pPVar5->super_FunctionProxy).field_0x45 = uVar3 & 0xbfff;
        }
      }
      else {
        *(uint *)&_auStack_38->field_0xb4 = uVar18 | 0x10;
        puVar2 = &(pPVar5->super_FunctionProxy).field_0x46;
        *puVar2 = *puVar2 & 0xdf;
        bVar7 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,PerfHintPhase);
        if (bVar7) {
          pFVar13 = FuncInfo::GetParsedFunctionBody(_auStack_38);
          WritePerfHint(HeapArgumentsDueToNonLocalRef,pFVar13,0);
        }
      }
    }
  }
  return _auStack_38;
}

Assistant:

FuncInfo* PostVisitFunction(ParseNodeFnc* pnodeFnc, ByteCodeGenerator* byteCodeGenerator)
{
    // Assign function-wide registers such as local frame object, closure environment, etc., based on
    // observed attributes. Propagate attributes to the parent function (if any).
    FuncInfo *top = byteCodeGenerator->TopFuncInfo();
    Symbol *sym = pnodeFnc->GetFuncSymbol();
    bool funcExprWithName = !top->IsGlobalFunction() && sym && sym->GetIsFuncExpr();

    if (top->IsLambda())
    {
        FuncInfo *enclosingNonLambda = byteCodeGenerator->FindEnclosingNonLambda();

        if (enclosingNonLambda->IsGlobalFunction())
        {
            top->byteCodeFunction->SetEnclosedByGlobalFunc();
        }

        if (FuncAllowsDirectSuper(enclosingNonLambda, byteCodeGenerator))
        {
            top->byteCodeFunction->GetFunctionInfo()->SetAllowDirectSuper();
        }
    }
    else if (FuncAllowsDirectSuper(top, byteCodeGenerator))
    {
        top->byteCodeFunction->GetFunctionInfo()->SetAllowDirectSuper();
    }

    // If this is a named function expression and has deferred child, mark has non-local reference.
    if (funcExprWithName)
    {
        // If we are reparsing this function due to being in debug mode - we should restore the state of this from the earlier parse
        if (top->byteCodeFunction->IsFunctionParsed() && top->GetParsedFunctionBody()->HasFuncExprNameReference())
        {
            top->SetFuncExprNameReference(true);
        }
        if (sym->GetHasNonLocalReference())
        {
            // Before doing this, though, make sure there's no local symbol that hides the function name
            // from the nested functions. If a lookup starting at the current local scope finds some symbol
            // other than the func expr, then it's hidden. (See Win8 393618.)
            byteCodeGenerator->ProcessCapturedSym(sym);

            top->SetFuncExprNameReference(true);
            if (pnodeFnc->pnodeBody)
            {
                top->GetParsedFunctionBody()->SetFuncExprNameReference(true);
            }
            byteCodeGenerator->ProcessScopeWithCapturedSym(sym->GetScope());
        }
    }

    if (pnodeFnc->nop != knopProg
        && !top->bodyScope->GetIsObject()
        && byteCodeGenerator->NeedObjectAsFunctionScope(top, pnodeFnc))
    {
        // Even if it wasn't determined during visiting this function that we need a scope object, we still have a few conditions that may require one.
        top->bodyScope->SetIsObject();
        if (!top->IsBodyAndParamScopeMerged())
        {
            // If we have the function inside an eval then access to outer variables should go through scope object.
            // So we set the body scope as object and we need to set the param scope also as object in case of split scope.
            top->paramScope->SetIsObject();
        }
    }

    if (pnodeFnc->nop == knopProg
        && top->byteCodeFunction->GetIsStrictMode()
        && (byteCodeGenerator->GetFlags() & fscrEval))
    {
        // At global scope inside a strict mode eval, vars will not leak out and require a scope object (along with its parent.)
        top->bodyScope->SetIsObject();
    }

    if (pnodeFnc->pnodeBody)
    {
        if (!top->IsGlobalFunction())
        {
            auto fnProcess =
                [byteCodeGenerator, top](Symbol *const sym)
                {
                    if (sym->GetHasNonLocalReference() && !sym->GetIsModuleExportStorage())
                    {
                        byteCodeGenerator->ProcessCapturedSym(sym);
                    }
                };

            Scope *bodyScope = top->bodyScope;
            Scope *paramScope = top->paramScope;
            if (paramScope != nullptr)
            {
                if (paramScope->GetHasOwnLocalInClosure())
                {
                    paramScope->ForEachSymbol(fnProcess);
                    top->SetHasLocalInClosure(true);
                }
            }

            if (bodyScope->GetHasOwnLocalInClosure())
            {
                bodyScope->ForEachSymbol(fnProcess);
                top->SetHasLocalInClosure(true);
            }

            PostVisitBlock(pnodeFnc->pnodeBodyScope, byteCodeGenerator);
            PostVisitBlock(pnodeFnc->pnodeScopes, byteCodeGenerator);
        }

        // This function refers to the closure environment if:
        // 1. it has a child function (we'll pass the environment to the constructor when the child is created -
        //      even if it's not needed, it's as cheap as loading "null" from the library);
        // 2. it calls eval (and will use the environment to construct the scope chain to pass to eval);
        // 3. it refers to a local defined in a parent function;
        // 4. some parent calls eval;
        // 5. we're in an event handler;
        // 6. the function was declared inside a "with";
        // 7. we're in an eval expression.
        if (pnodeFnc->nestedCount != 0 ||
            top->GetCallsEval() ||
            top->GetHasClosureReference() ||
            byteCodeGenerator->InDynamicScope() ||
            (byteCodeGenerator->GetFlags() & (fscrImplicitThis | fscrEval)))
        {
            byteCodeGenerator->SetNeedEnvRegister();
        }

        // This function needs to construct a local frame on the heap if it is not the global function (even in eval) and:
        // 1. it calls eval, which may refer to or declare any locals in this frame;
        // 2. a child calls eval (which may refer to locals through a closure);
        // 3. it uses non-strict mode "arguments", so the arguments have to be put in a closure;
        // 4. it defines a local that is used by a child function (read from a closure).
        // 5. it is a main function that's wrapped in a function expression scope but has locals used through
        //    a closure (used in forReference function call cases in a with for example).
        if (!top->IsGlobalFunction())
        {
            if (top->GetCallsEval() ||
                top->GetChildCallsEval() ||
                (top->GetHasArguments() && byteCodeGenerator->NeedScopeObjectForArguments(top, pnodeFnc)) ||
                top->GetHasLocalInClosure() ||
                (top->funcExprScope && top->funcExprScope->GetMustInstantiate()) ||
                // When we have split scope normally either eval will be present or the GetHasLocalInClosure will be true as one of the formal is
                // captured. But when we force split scope or split scope happens due to some other reasons we have to make sure we allocate frame
                // slot register here.
                (!top->IsBodyAndParamScopeMerged()))
            {
                if (!top->GetCallsEval() && top->GetHasLocalInClosure())
                {
                    byteCodeGenerator->AssignFrameSlotsRegister();
                }

                if (!top->IsBodyAndParamScopeMerged())
                {
                    byteCodeGenerator->AssignParamSlotsRegister();
                }

                if (byteCodeGenerator->NeedObjectAsFunctionScope(top, top->root)
                    || top->bodyScope->GetIsObject()
                    || top->paramScope->GetIsObject())
                {
                    byteCodeGenerator->AssignFrameObjRegister();
                }

                // The function also needs to construct a frame display if:
                // 1. it calls eval;
                // 2. it has a child function.
                // 3. When has arguments and in debug mode. So that frame display be there along with frame object register.
                if (top->GetCallsEval() ||
                    pnodeFnc->nestedCount != 0
                    || (top->GetHasArguments()
                        && (pnodeFnc->pnodeParams != nullptr)
                        && byteCodeGenerator->IsInDebugMode()))
                {
                    byteCodeGenerator->SetNeedEnvRegister(); // This to ensure that Env should be there when the FrameDisplay register is there.
                    byteCodeGenerator->AssignFrameDisplayRegister();
                }
            }

            if (top->GetHasArguments())
            {
                Symbol *argSym = top->GetArgumentsSymbol();
                Assert(argSym);
                if (argSym)
                {
                    Assert(top->bodyScope->GetScopeSlotCount() == 0);
                    Assert(top->argsPlaceHolderSlotCount == 0);
                    byteCodeGenerator->AssignRegister(argSym);
                    uint i = 0;
                    auto setArgScopeSlot = [&](ParseNode *pnodeArg)
                    {
                        if (pnodeArg->IsVarLetOrConst())
                        {
                            Symbol* sym = pnodeArg->AsParseNodeVar()->sym;
                            if (sym->GetScopeSlot() != Js::Constants::NoProperty)
                            {
                                top->argsPlaceHolderSlotCount++; // Same name args appeared before
                            }
                            sym->SetScopeSlot(i);
                        }
                        else if (pnodeArg->nop == knopParamPattern)
                        {
                            top->argsPlaceHolderSlotCount++;
                        }
                        i++;
                    };

                    // We need to include the rest as well -as it will get slot assigned.
                    if (byteCodeGenerator->NeedScopeObjectForArguments(top, pnodeFnc))
                    {
                        MapFormals(pnodeFnc, setArgScopeSlot);
                        if (argSym->NeedsSlotAlloc(byteCodeGenerator, top))
                        {
                            Assert(argSym->GetScopeSlot() == Js::Constants::NoProperty);
                            argSym->SetScopeSlot(i++);
                        }
                        MapFormalsFromPattern(pnodeFnc, setArgScopeSlot);
                    }

                    top->paramScope->SetScopeSlotCount(i);

                    Assert(top->GetHasHeapArguments());
                    if (byteCodeGenerator->NeedScopeObjectForArguments(top, pnodeFnc)
                        && !pnodeFnc->HasNonSimpleParameterList())
                    {
                        top->byteCodeFunction->SetHasImplicitArgIns(false);
                    }
                }
            }
        }
        else
        {
            Assert(top->IsGlobalFunction() || pnodeFnc->IsModule());
            // eval is called in strict mode
            bool newScopeForEval = (top->byteCodeFunction->GetIsStrictMode() && (byteCodeGenerator->GetFlags() & fscrEval));

            if (newScopeForEval)
            {
                byteCodeGenerator->SetNeedEnvRegister();
                byteCodeGenerator->AssignFrameObjRegister();
                byteCodeGenerator->AssignFrameDisplayRegister();
            }
        }

        if (top->GetNewTargetSymbol())
        {
            byteCodeGenerator->AssignRegister(top->GetNewTargetSymbol());
        }
        if (top->GetThisSymbol())
        {
            byteCodeGenerator->AssignRegister(top->GetThisSymbol());

            // Indirect eval has a 'this' binding and needs to load from null
            if (top->IsGlobalFunction())
            {
                byteCodeGenerator->AssignNullConstRegister();
            }
        }
        if (top->GetSuperSymbol())
        {
            byteCodeGenerator->AssignRegister(top->GetSuperSymbol());
        }
        if (top->GetSuperConstructorSymbol())
        {
            byteCodeGenerator->AssignRegister(top->GetSuperConstructorSymbol());
        }
        if (top->GetImportMetaSymbol())
        {
            byteCodeGenerator->AssignRegister(top->GetImportMetaSymbol());
        }

        Assert(!funcExprWithName || sym);
        if (funcExprWithName)
        {
            Assert(top->funcExprScope);
            // If the func expr may be accessed via eval, force the func expr scope into an object.
            if (top->GetCallsEval() || top->GetChildCallsEval())
            {
                top->funcExprScope->SetIsObject();
            }
            if (top->funcExprScope->GetIsObject())
            {
                top->funcExprScope->SetLocation(byteCodeGenerator->NextVarRegister());
            }
        }
    }

    byteCodeGenerator->EndBindFunction(funcExprWithName);

    // If the "child" is the global function, we're done.
    if (top->IsGlobalFunction())
    {
        return top;
    }

    if (top->IsBodyAndParamScopeMerged())
    {
        Scope::MergeParamAndBodyScopes(pnodeFnc);
        Scope::RemoveParamScope(pnodeFnc);
    }
    else
    {
        // A param and body scope exist for the same function, they
        // should both either be using scope slots or scope objects.
        Assert_FailFast(top->bodyScope->GetIsObject() == top->paramScope->GetIsObject());
    }

    FuncInfo* const parentFunc = byteCodeGenerator->TopFuncInfo();

    Js::FunctionBody * parentFunctionBody = parentFunc->byteCodeFunction->GetFunctionBody();
    Assert(parentFunctionBody != nullptr);
    bool setHasNonLocalReference = parentFunctionBody->HasAllNonLocalReferenced();

    // This is required for class constructors as will be able to determine the actual home object register only after emitting InitClass
    if (pnodeFnc->HasHomeObj() && pnodeFnc->GetHomeObjLocation() == Js::Constants::NoRegister)
    {
        pnodeFnc->SetHomeObjLocation(parentFunc->AssignUndefinedConstRegister());
    }

    // If we have any deferred child, we need to instantiate the fake global block scope if it is not empty
    if (parentFunc->IsGlobalFunction())
    {
        if (byteCodeGenerator->IsEvalWithNoParentScopeInfo())
        {
            Scope * globalEvalBlockScope = parentFunc->GetGlobalEvalBlockScope();
            if (globalEvalBlockScope->GetHasOwnLocalInClosure())
            {
                globalEvalBlockScope->SetMustInstantiate(true);
            }
        }
    }
    else
    {
        if (setHasNonLocalReference)
        {
            // All locals are already marked as non-locals-referenced. Mark the parent as well.
            if (parentFunctionBody->HasSetIsObject())
            {
                // Updated the current function, as per the previous stored info.
                parentFunc->GetBodyScope()->SetIsObject();
                parentFunc->GetParamScope()->SetIsObject();
            }
        }
        // Propagate HasMaybeEscapedNestedFunc
        if (!byteCodeGenerator->CanStackNestedFunc(top, false) ||
            byteCodeGenerator->NeedObjectAsFunctionScope(top, pnodeFnc))
        {
            parentFunc->SetHasMaybeEscapedNestedFunc(DebugOnly(_u("Child")));
        }
    }

    if (top->GetCallsEval() || top->GetChildCallsEval())
    {
        parentFunc->SetChildCallsEval(true);
        ParseNodeBlock *currentBlock = byteCodeGenerator->GetCurrentBlock();
        if (currentBlock)
        {
            Assert(currentBlock->nop == knopBlock);
            currentBlock->SetChildCallsEval(true);
        }
        parentFunc->SetHasHeapArguments(true);
        setHasNonLocalReference = true;
        parentFunctionBody->SetAllNonLocalReferenced(true);

        Scope * const funcExprScope = top->funcExprScope;
        if (funcExprScope)
        {
            // If we have the body scope as an object, the outer function expression scope also needs to be an object to propagate the name.
            funcExprScope->SetIsObject();
        }

        if (parentFunc->inArgsCount == 1)
        {
            // If no formals to function, no need to create the propertyid array
            byteCodeGenerator->AssignNullConstRegister();
        }
    }

    if (setHasNonLocalReference && !parentFunctionBody->HasDoneAllNonLocalReferenced())
    {
        parentFunc->GetBodyScope()->ForceAllSymbolNonLocalReference(byteCodeGenerator);
        if (!parentFunc->IsGlobalFunction())
        {
            parentFunc->GetParamScope()->ForceAllSymbolNonLocalReference(byteCodeGenerator);
        }
        parentFunctionBody->SetHasDoneAllNonLocalReferenced(true);
    }

    if (pnodeFnc->IsGenerator())
    {
        top->AssignUndefinedConstRegister();
    }

    if ((top->root->IsConstructor() && (top->GetCallsEval() || top->GetChildCallsEval())) || top->IsClassConstructor())
    {
        if (!top->IsBaseClassConstructor())
        {
            // Derived class constructors need to check undefined against explicit return statements.
            top->AssignUndefinedConstRegister();
        }
    }

    AssignFuncSymRegister(pnodeFnc, byteCodeGenerator, top);

    if (pnodeFnc->pnodeBody && pnodeFnc->HasReferenceableBuiltInArguments() && pnodeFnc->UsesArguments() &&
        pnodeFnc->HasHeapArguments())
    {
        bool doStackArgsOpt = top->byteCodeFunction->GetDoBackendArgumentsOptimization();

        bool hasAnyParamInClosure = top->GetHasLocalInClosure() && top->GetParamScope()->GetHasOwnLocalInClosure();

        if ((doStackArgsOpt && top->inArgsCount > 1))
        {
            if (doStackArgsOpt && hasAnyParamInClosure)
            {
                top->SetHasHeapArguments(true, false /*= Optimize arguments in backend*/);
#ifdef PERF_HINT
                if (PHASE_TRACE1(Js::PerfHintPhase))
                {
                    WritePerfHint(PerfHints::HeapArgumentsDueToNonLocalRef, top->GetParsedFunctionBody(), 0);
                }
#endif
            }
            else if (!top->GetHasLocalInClosure() && !(byteCodeGenerator->GetFlags() & fscrEval) && !top->byteCodeFunction->IsEval())
            {
                //Scope object creation instr will be a MOV NULL instruction in the Lowerer - if we still decide to do StackArgs after Globopt phase.
                //Note that if we're in eval, scoped ldfld/stfld will traverse the whole frame display, including this slot, so it can't be null.
                top->byteCodeFunction->SetDoScopeObjectCreation(false);
            }
        }
    }
    return top;
}